

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

void __thiscall
TPZFMatrix<long>::MultAdd
          (TPZFMatrix<long> *this,TPZFMatrix<long> *x,TPZFMatrix<long> *y,TPZFMatrix<long> *z,
          long alpha,long beta,int opt)

{
  long *plVar1;
  ulong uVar2;
  long *plVar3;
  long lVar4;
  long *plVar5;
  int64_t i;
  ulong uVar6;
  long lVar7;
  long *plVar8;
  char *msg1;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long *plVar13;
  bool bVar14;
  
  lVar7 = (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  if (opt == 0) {
    if ((this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol != lVar7) goto LAB_00bccacf;
    bVar14 = beta == 0;
    if ((!bVar14) &&
       ((msg1 = "TPZFMatrix::MultAdd matrix y with incompatible dimensions>",
        (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow !=
        (y->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow ||
        ((y->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol !=
         (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol)))) goto LAB_00bccad6;
    if ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol ==
        (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol) {
      lVar7 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
      goto LAB_00bccb14;
    }
  }
  else {
    if ((this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow != lVar7) {
LAB_00bccacf:
      msg1 = "TPZFMatrix::MultAdd matrix x with incompatible dimensions>";
LAB_00bccad6:
      Error(msg1,(char *)0x0);
      return;
    }
    if (beta == 0) {
      bVar14 = true;
    }
    else {
      msg1 = "TPZFMatrix::MultAdd matrix y with incompatible dimensions>";
      if (((this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol !=
           (y->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow) ||
         ((y->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol !=
          (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol)) goto LAB_00bccad6;
      bVar14 = false;
    }
    if ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol ==
        (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol) {
      lVar7 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
LAB_00bccb14:
      if ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow == lVar7) goto LAB_00bccb29;
    }
  }
  (*(z->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])(z);
LAB_00bccb29:
  uVar9 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  if (uVar9 == 0) {
    (*(z->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])(z);
    uVar9 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  }
  uVar2 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
  uVar12 = uVar9;
  if (opt == 0) {
    uVar12 = uVar2;
  }
  lVar7 = (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  uVar12 = uVar12 & 0xffffffff;
  if (0 < lVar7 && uVar12 != 0) {
    lVar10 = 0;
    lVar11 = 0;
    do {
      lVar4 = (z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
      if ((lVar4 < 1) || ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol <= lVar11)) {
        Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (bVar14) {
        memset(z->fElem + lVar4 * lVar11,0,uVar12 * 8);
      }
      else {
        if (z != y) {
          memcpy(z->fElem + lVar4 * lVar11,
                 y->fElem + (y->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * lVar11,uVar12 * 8)
          ;
        }
        uVar6 = 0;
        do {
          lVar4 = (z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
          if ((lVar4 <= (long)uVar6) ||
             ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol <= lVar11)) {
            Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar4 = lVar4 * lVar10;
          *(long *)((long)z->fElem + uVar6 * 8 + lVar4) =
               *(long *)((long)z->fElem + uVar6 * 8 + lVar4) * beta;
          uVar6 = uVar6 + 1;
        } while (uVar12 != uVar6);
      }
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 8;
    } while (lVar11 != lVar7);
  }
  if ((uVar2 != 0 && uVar9 != 0) && 0 < lVar7) {
    lVar10 = 0;
    do {
      if (opt == 0) {
        if (0 < (long)uVar9) {
          uVar12 = 0;
          do {
            lVar11 = (z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
            if ((lVar11 < 1) || ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol <= lVar10)) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (0 < (long)uVar2) {
              plVar5 = z->fElem + lVar11 * lVar10;
              lVar11 = (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
              plVar3 = x->fElem;
              plVar13 = plVar5 + uVar2;
              plVar8 = this->fElem + uVar12 * uVar2;
              do {
                *plVar5 = *plVar5 + *plVar8 * alpha * plVar3[lVar11 * lVar10 + uVar12];
                plVar8 = plVar8 + 1;
                plVar5 = plVar5 + 1;
              } while (plVar5 < plVar13);
            }
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar9);
        }
      }
      else {
        plVar13 = this->fElem;
        lVar11 = (z->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
        if ((lVar11 < 1) || ((z->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol <= lVar10)) {
          Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if (0 < (long)uVar9) {
          plVar5 = z->fElem + lVar11 * lVar10;
          plVar3 = x->fElem;
          uVar12 = 0;
          do {
            if ((long)uVar2 < 1) {
              lVar11 = 0;
            }
            else {
              plVar8 = plVar3 + (x->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow * lVar10;
              plVar1 = plVar8 + uVar2;
              lVar11 = 0;
              do {
                lVar4 = *plVar13;
                plVar13 = plVar13 + 1;
                lVar11 = lVar11 + *plVar8 * lVar4;
                plVar8 = plVar8 + 1;
              } while (plVar8 < plVar1);
            }
            *plVar5 = *plVar5 + lVar11 * alpha;
            plVar5 = plVar5 + 1;
            uVar12 = uVar12 + 1;
          } while (uVar12 != uVar9);
        }
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar7);
  }
  return;
}

Assistant:

void TPZFMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x,const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,
                               const TVar alpha,const TVar beta,const int opt) const {
    
    if ((!opt && this->Cols() != x.Rows()) || (opt && this->Rows() != x.Rows())) {
        Error( "TPZFMatrix::MultAdd matrix x with incompatible dimensions>" );
        return;
    }
    if(beta != (TVar)0. && ((!opt && this->Rows() != y.Rows()) || (opt && this->Cols() != y.Rows()) || y.Cols() != x.Cols())) {
        Error( "TPZFMatrix::MultAdd matrix y with incompatible dimensions>" );
        return;
    }
    if(!opt) {
        if(z.Cols() != x.Cols() || z.Rows() != this->Rows()) {
            z.Redim(this->Rows(),x.Cols());
        }
    } else {
        if(z.Cols() != x.Cols() || z.Rows() != this->Cols()) {
            z.Redim(this->Cols(),x.Cols());
        }
    }
    if(this->Cols() == 0)
    {
        z.Zero();
    }
    unsigned numeq = opt ? this->Cols() : this->Rows();
    int64_t rows = this->Rows();
    int64_t cols = this->Cols();
    int64_t xcols = x.Cols();
    int64_t ic, c;
    if (numeq)
    {
        for (ic = 0; ic < xcols; ic++) {
            TVar *zp = &z(0,ic), *zlast = zp+numeq;
            if(beta != (TVar)0.) {
                const TVar *yp = &y.g(0,ic);
                if(&z != &y) {
                    memcpy((void *)zp,(void *)yp,numeq*sizeof(TVar));
                }
                for(int64_t i=0; i< numeq; i++) z(i,ic) *= beta;
                
            } else {
                while(zp != zlast) {
                    *zp = 0.;
                    zp ++;
                }
            }
        }
    }
    
    if(!(rows*cols)) return;
    
    for (ic = 0; ic < xcols; ic++) {
        if(!opt) {
            for ( c = 0; c<cols; c++) {
                TVar * zp = &z(0,ic), *zlast = zp+rows;
                TVar * fp = fElem +rows*c;
                const TVar * xp = &x.g(c,ic);
                while(zp < zlast) {
                    *zp += alpha* *fp++ * *xp;
                    zp ++;
                }
            }
        } else {
            TVar * fp = fElem,  *zp = &z(0,ic);
            for (c = 0; c<cols; c++) {
                TVar val = 0.;
                // bug correction philippe 5/2/97
                //					 REAL * xp = &x(0,ic), xlast = xp + numeq;
                const TVar *xp = &x.g(0,ic);
                const TVar *xlast = xp + rows;
                while(xp < xlast) {
                    val += *fp++ * *xp;
                    xp ++;
                }
                *zp += alpha *val;
                zp ++;
            }
        }
    }
    
}